

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O3

void Amap_LibCollectFanins_rec(Amap_Lib_t *pLib,Amap_Nod_t *pNod,Vec_Int_t *vFanins)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = *(uint *)pNod;
  do {
    if ((short)uVar2 == 0) {
      uVar3 = 0;
      break;
    }
    uVar3 = (uint)pNod->iFan0;
    if (pNod->iFan0 < 0) {
LAB_003b47af:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10c,"int Abc_Lit2Var(int)");
    }
    if (((uVar3 & 1) == 0) && ((uVar2 ^ *(uint *)(pLib->pNodes + (uVar3 >> 1))) < 0x1000000)) {
      Amap_LibCollectFanins_rec(pLib,pLib->pNodes + (uVar3 >> 1),vFanins);
    }
    else {
      Vec_IntPush(vFanins,uVar3);
    }
    uVar3 = (uint)pNod->iFan1;
    if ((int)uVar3 < 0) goto LAB_003b47af;
    if ((uVar3 & 1) != 0) break;
    uVar1 = *(uint *)pNod;
    pNod = pLib->pNodes + (uVar3 >> 1);
    uVar2 = *(uint *)pNod;
  } while ((uVar1 ^ uVar2) < 0x1000000);
  Vec_IntPush(vFanins,uVar3);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects fanins of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Amap_LibCollectFanins_rec( Amap_Lib_t * pLib, Amap_Nod_t * pNod, Vec_Int_t * vFanins )
{
    Amap_Nod_t * pFan0, * pFan1;
    if ( pNod->Id == 0 )
    {
        Vec_IntPush( vFanins, 0 );
        return;
    }
    pFan0 = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan0) );
    if ( Abc_LitIsCompl(pNod->iFan0) || pFan0->Type != pNod->Type )
        Vec_IntPush( vFanins, pNod->iFan0 );
    else
        Amap_LibCollectFanins_rec( pLib, pFan0, vFanins );
    pFan1 = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan1) );
    if ( Abc_LitIsCompl(pNod->iFan1) || pFan1->Type != pNod->Type )
        Vec_IntPush( vFanins, pNod->iFan1 );
    else
        Amap_LibCollectFanins_rec( pLib, pFan1, vFanins );
}